

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O1

void check_ansv<unsigned_long,2>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,bool left,size_t nonsv)

{
  pointer puVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  AssertHelperData *pAVar4;
  pointer puVar5;
  bool bVar6;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  range_end;
  char *pcVar9;
  char *in_R9;
  AssertionResult gtest_ar_;
  size_t s;
  AssertionResult gtest_ar;
  unsigned_long m;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  minquery;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string local_d0;
  AssertHelper local_b0;
  AssertHelper local_a8;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  local_a0;
  
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::rmq(&local_a0,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish,0x100,8);
  local_d8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var8._M_current =
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  range_end._M_current =
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)range_end._M_current - (long)_Var8._M_current != 0) {
    pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)range_end._M_current - (long)_Var8._M_current >> 3);
    do {
      puVar1 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar1[(long)local_d8] == nonsv) {
        if (left && local_d8 !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          _Var8 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                  ::query(&local_a0,_Var8,_Var8._M_current + (long)(local_d8 + 1));
          uVar2 = *_Var8._M_current;
          puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar3[(long)local_d8] == uVar2) {
            local_f8.ptr_._0_1_ = 1;
            local_f0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
          }
          else {
            local_f8.ptr_._0_1_ = *puVar3 == uVar2;
            local_f0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!(bool)local_f8.ptr_._0_1_) {
              testing::Message::Message((Message *)&local_e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_e0.ptr_ + 0x10)," at i=",6);
              std::ostream::_M_insert<unsigned_long>((ulong)(local_e0.ptr_ + 0x10));
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_d0,(internal *)&local_f8,
                         (AssertionResult *)"in[i] == m || in[0] == m","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x29,(char *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                                (char)local_d0._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
                  &local_d0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                         (char)local_d0._M_dataplus._M_p));
              }
              if (local_e0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar6 = testing::internal::IsTrue(true);
                if ((bVar6) &&
                   (local_e0.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_e0.ptr_ + 8))();
                }
                local_e0.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else if (local_d8 + 1 < pbVar7 && !left) {
          _Var8 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                  ::query(&local_a0,_Var8._M_current + (long)local_d8,range_end);
          bVar6 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)local_d8] == *_Var8._M_current;
          local_f8.ptr_._0_1_ = bVar6;
          local_f0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (!bVar6) {
            testing::Message::Message((Message *)&local_e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_e0.ptr_ + 0x10)," at i=",6);
            std::ostream::_M_insert<unsigned_long>((ulong)(local_e0.ptr_ + 0x10));
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_d0,(internal *)&local_f8,(AssertionResult *)"in[i] == m","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x2c,(char *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                              (char)local_d0._M_dataplus._M_p));
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_e0);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
                &local_d0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                       (char)local_d0._M_dataplus._M_p));
            }
            if (local_e0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar6 = testing::internal::IsTrue(true);
              if ((bVar6) &&
                 (local_e0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_e0.ptr_ + 8))();
              }
              local_e0.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
      else {
        local_e0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             puVar1[(long)local_d8];
        if (left) {
          testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                    ((internal *)&local_d0,"s","i",(unsigned_long *)&local_e0,
                     (unsigned_long *)&local_d8);
          if ((char)local_d0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_f8);
            pcVar9 = "";
            if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
              pcVar9 = *(char **)local_d0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x31,pcVar9);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar6 = testing::internal::IsTrue(true);
              if ((bVar6) &&
                 (local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_f8.ptr_ + 8))();
              }
              local_f8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_e0.ptr_ + 1 < local_d8) {
            puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            _Var8 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query(&local_a0,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar1 + (long)(local_e0.ptr_ + 1)),
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar1 + (long)local_d8));
            local_b0.data_ = (AssertHelperData *)*_Var8._M_current;
            puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if (local_b0.data_ < (AssertHelperData *)puVar1[(long)local_d8]) {
              local_f8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)local_f8.ptr_._1_7_ << 8);
LAB_0012ee14:
              local_f0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_d0,(internal *)&local_f8,
                         (AssertionResult *)"in[i] <= m && in[s] <= m","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x3a,(char *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                                (char)local_d0._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e8);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
                  &local_d0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                         (char)local_d0._M_dataplus._M_p));
              }
              if (local_e8.data_ != (AssertHelperData *)0x0) {
                bVar6 = testing::internal::IsTrue(true);
                if ((bVar6) && (local_e8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_e8.data_ + 8))();
                }
                local_e8.data_ = (AssertHelperData *)0x0;
              }
            }
            else {
              pAVar4 = (AssertHelperData *)puVar1[(long)local_e0.ptr_];
              local_f8.ptr_._0_1_ = pAVar4 <= local_b0.data_;
              local_f0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_b0.data_ < pAVar4) goto LAB_0012ee14;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_f0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            puVar3 = puVar1 + (long)local_d8;
            if (*puVar3 == puVar1[(long)local_e0.ptr_]) {
              puVar5 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if (puVar5[(long)local_e0.ptr_] != nonsv) {
                testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                          ((internal *)&local_d0,"in[nsv[s]]","in[i]",
                           puVar1 + puVar5[(long)local_e0.ptr_],puVar3);
                if ((char)local_d0._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10)," for i=",7);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", in[i]=",8);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", in[s]=",8);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),",s=",3);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", nsv[s]=",9);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", in.size()=",0xc);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  pcVar9 = "";
                  if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
                    pcVar9 = *(char **)local_d0._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_e8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                             ,0x41,pcVar9);
                  testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f8);
                  testing::internal::AssertHelper::~AssertHelper(&local_e8);
                  if (local_f8.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar6 = testing::internal::IsTrue(true);
                    if ((bVar6) &&
                       (local_f8.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_f8.ptr_ + 8))();
                    }
                    local_f8.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_d0._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                puVar1 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (puVar1[(long)local_e0.ptr_] + 1) < local_e0.ptr_) {
                  puVar5 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  _Var8 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                          ::query(&local_a0,
                                  (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )(puVar5 + puVar1[(long)local_e0.ptr_] + 1),
                                  (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )(puVar5 + (long)local_e0.ptr_));
                  local_f8.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       *_Var8._M_current;
                  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                            ((internal *)&local_d0,"m2","in[i]",(unsigned_long *)&local_f8,
                             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                             ._M_impl.super__Vector_impl_data._M_start + (long)local_d8);
                  if ((char)local_d0._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_e8);
                    pcVar9 = "";
                    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
                      pcVar9 = *(char **)local_d0._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                               ,0x44,pcVar9);
                    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e8);
                    testing::internal::AssertHelper::~AssertHelper(&local_a8);
                    if (local_e8.data_ != (AssertHelperData *)0x0) {
                      bVar6 = testing::internal::IsTrue(true);
                      if ((bVar6) && (local_e8.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_e8.data_ + 8))();
                      }
                      local_e8.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_d0._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
              }
            }
            else {
              testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                        ((internal *)&local_d0,"in[i]","m",puVar3,(unsigned_long *)&local_b0);
              if ((char)local_d0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10)," for i=",7);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),", in[i]=",8);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),", in[s]=",8);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),",s=",3);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                pcVar9 = "";
                if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
                  pcVar9 = *(char **)local_d0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                           ,0x49,pcVar9);
                testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_e8);
                if (local_f8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar6 = testing::internal::IsTrue(true);
                  if ((bVar6) &&
                     (local_f8.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_f8.ptr_ + 8))();
                  }
                  local_f8.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
          }
          puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                    ((internal *)&local_d0,"in[s]","in[i]",puVar1 + (long)local_e0.ptr_,
                     puVar1 + (long)local_d8);
          if ((char)local_d0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_f8);
            pcVar9 = "";
            if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
              pcVar9 = *(char **)local_d0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x53,pcVar9);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar6 = testing::internal::IsTrue(true);
              if ((bVar6) &&
                 (local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_f8.ptr_ + 8))();
              }
              local_f8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                    ((internal *)&local_d0,"s","i",(unsigned_long *)&local_e0,
                     (unsigned_long *)&local_d8);
          if ((char)local_d0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_f8);
            pcVar9 = "";
            if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
              pcVar9 = *(char **)local_d0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x57,pcVar9);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar6 = testing::internal::IsTrue(true);
              if ((bVar6) &&
                 (local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_f8.ptr_ + 8))();
              }
              local_f8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_d8 < local_e0.ptr_ + -1) {
            puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            _Var8 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query(&local_a0,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar1 + (long)(local_d8 + 1)),
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar1 + (long)local_e0.ptr_));
            local_b0.data_ = (AssertHelperData *)*_Var8._M_current;
            puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if (local_b0.data_ < (AssertHelperData *)puVar1[(long)local_d8]) {
              local_f8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)local_f8.ptr_._1_7_ << 8);
LAB_0012f1da:
              local_f0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_e8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_e8.data_)->line," for range [",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_e8.data_)->line,",",1);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_e8.data_)->line,"]",1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_d0,(internal *)&local_f8,
                         (AssertionResult *)"in[i] <= m && in[s] <= m","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x5e,(char *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                                (char)local_d0._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e8);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
                  &local_d0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                         (char)local_d0._M_dataplus._M_p));
              }
              if (local_e8.data_ != (AssertHelperData *)0x0) {
                bVar6 = testing::internal::IsTrue(true);
                if ((bVar6) && (local_e8.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_e8.data_ + 8))();
                }
                local_e8.data_ = (AssertHelperData *)0x0;
              }
            }
            else {
              pAVar4 = (AssertHelperData *)puVar1[(long)local_e0.ptr_];
              local_f8.ptr_._0_1_ = pAVar4 <= local_b0.data_;
              local_f0.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_b0.data_ < pAVar4) goto LAB_0012f1da;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_f0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            puVar3 = puVar1 + (long)local_d8;
            if (*puVar3 == puVar1[(long)local_e0.ptr_]) {
              puVar5 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if (puVar5[(long)local_e0.ptr_] != nonsv) {
                testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                          ((internal *)&local_d0,"in[nsv[s]]","in[i]",
                           puVar1 + puVar5[(long)local_e0.ptr_],puVar3);
                if ((char)local_d0._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10)," for i=",7);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", in[i]=",8);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", in[s]=",8);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),",s=",3);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", nsv[s]=",9);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_f8.ptr_ + 0x10),", in.size()=",0xc);
                  std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                  pcVar9 = "";
                  if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
                    pcVar9 = *(char **)local_d0._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_e8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                             ,100,pcVar9);
                  testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f8);
                  testing::internal::AssertHelper::~AssertHelper(&local_e8);
                  if (local_f8.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar6 = testing::internal::IsTrue(true);
                    if ((bVar6) &&
                       (local_f8.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_f8.ptr_ + 8))();
                    }
                    local_f8.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_d0._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                puVar1 = (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if (local_e0.ptr_ + 1 <
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    puVar1[(long)local_e0.ptr_]) {
                  puVar5 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  _Var8 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                          ::query(&local_a0,
                                  (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )(puVar5 + (long)(local_e0.ptr_ + 1)),
                                  (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   )(puVar5 + puVar1[(long)local_e0.ptr_]));
                  local_f8.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       *_Var8._M_current;
                  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                            ((internal *)&local_d0,"m2","in[i]",(unsigned_long *)&local_f8,
                             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                             ._M_impl.super__Vector_impl_data._M_start + (long)local_d8);
                  if ((char)local_d0._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_e8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&(local_e8.data_)->line," for i=",7);
                    std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&(local_e8.data_)->line,", in[i]=",8);
                    std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&(local_e8.data_)->line,", in[s]=",8);
                    std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&(local_e8.data_)->line,",s=",3);
                    std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&(local_e8.data_)->line,", nsv[s]=",9);
                    std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&(local_e8.data_)->line,", in.size()=",0xc);
                    std::ostream::_M_insert<unsigned_long>((ulong)&(local_e8.data_)->line);
                    pcVar9 = "";
                    if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
                      pcVar9 = *(char **)local_d0._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                               ,0x67,pcVar9);
                    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e8);
                    testing::internal::AssertHelper::~AssertHelper(&local_a8);
                    if (local_e8.data_ != (AssertHelperData *)0x0) {
                      bVar6 = testing::internal::IsTrue(true);
                      if ((bVar6) && (local_e8.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_e8.data_ + 8))();
                      }
                      local_e8.data_ = (AssertHelperData *)0x0;
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_d0._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
              }
            }
            else {
              testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                        ((internal *)&local_d0,"in[i]","m",puVar3,(unsigned_long *)&local_b0);
              if ((char)local_d0._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10)," for i=",7);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),", in[i]=",8);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),", in[s]=",8);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),",s=",3);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),", nsv[s]=",9);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_f8.ptr_ + 0x10),", in.size()=",0xc);
                std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
                pcVar9 = "";
                if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
                  pcVar9 = *(char **)local_d0._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                           ,0x6d,pcVar9);
                testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f8);
                testing::internal::AssertHelper::~AssertHelper(&local_e8);
                if (local_f8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar6 = testing::internal::IsTrue(true);
                  if ((bVar6) &&
                     (local_f8.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_f8.ptr_ + 8))();
                  }
                  local_f8.ptr_ =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x0;
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d0._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
          }
          puVar1 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                    ((internal *)&local_d0,"in[s]","in[i]",puVar1 + (long)local_e0.ptr_,
                     puVar1 + (long)local_d8);
          if ((char)local_d0._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_f8);
            pcVar9 = "";
            if ((undefined8 *)local_d0._M_string_length != (undefined8 *)0x0) {
              pcVar9 = *(char **)local_d0._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x77,pcVar9);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            if (local_f8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar6 = testing::internal::IsTrue(true);
              if ((bVar6) &&
                 (local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_f8.ptr_ + 8))();
              }
              local_f8.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
      local_d8 = local_d8 + 1;
      _Var8._M_current =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
      range_end._M_current =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)range_end._M_current - (long)_Var8._M_current >> 3);
    } while (local_d8 < pbVar7);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_a0.block_mins);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0.superblock_mins);
  return;
}

Assistant:

void check_ansv(const std::vector<T>& in, const std::vector<size_t>& nsv, bool left, size_t nonsv) {
    // construct RMQ
    rmq<typename std::vector<T>::const_iterator> minquery(in.cbegin(), in.cend());

    // for each position check the nsv and direction
    for (size_t i = 0; i < in.size(); ++i) {
        if (nsv[i] == nonsv) {
            if (left && i > 0) {
                // expect this is an overall minimum of the range [0, i]
                T m = *minquery.query(in.cbegin(), in.cbegin()+i+1);
                EXPECT_TRUE(in[i] == m || in[0] == m) << " at i=" << i;
            } else if (!left && i+1 < in.size()) {
                T m = *minquery.query(in.cbegin()+i, in.cend());
                EXPECT_TRUE(in[i] == m) << " at i=" << i;
            }
        } else {
            size_t s = nsv[i];
            if (left) {
                EXPECT_LT(s, i);
                // no other element can be smaller than `in[i]` after `in[s]`
                if (s+1 < i) {
                    T m = *minquery.query(in.cbegin()+s+1, in.cbegin()+i);
                    if (type == nearest_sm) {
                        // check that there is nothing smaller than in[i] in the range
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << s+1 << "," << i << "]";
                    } else if (type == furthest_eq) {
                        // test that no smaller values lay in between
                        EXPECT_TRUE(in[i] <= m && in[s] <= m);

                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (nsv[s]+1 < s) {
                                    T m2 = *minquery.query(in.cbegin()+nsv[s]+1, in.cbegin()+s);
                                    EXPECT_GT(m2, in[i]);
                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s;
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m);
                    }
                }
                // element at `s` is smaller than `in[i]`
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }

            } else {
                EXPECT_GT(s, i);
                // no other element can be smaller than `in[i]` before `in[s]`
                if (i < s-1) {
                    T m = *minquery.query(in.cbegin()+i+1, in.cbegin()+s);
                    if (type == nearest_sm) {
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    } else if (type == furthest_eq) {
                        EXPECT_TRUE(in[i] <= m && in[s] <= m) << " for range [" << i << "," << s-1 << "]";
                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (s+1 < nsv[s]) {
                                    T m2 = *minquery.query(in.cbegin()+s+1, in.cbegin()+nsv[s]);
                                    EXPECT_GT(m2, in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();

                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    }
                }
                // element at `s` is smaller than in[i]
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }
            }

        }
    }
}